

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * to_str_abi_cxx11_(uint32_t c)

{
  undefined4 in_register_0000003c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_10;
  uint32_t c_local;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_0000003c,c);
  pbStack_10 = __lhs;
  to_str_abi_cxx11_((uint16_t)local_38);
  to_str_abi_cxx11_((uint16_t)local_58);
  std::operator+(__lhs,local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_38);
  return __lhs;
}

Assistant:

static std::string to_str(uint32_t c)
{ return to_str(uint16_t((0xFFFF0000 & c) >> 16)) + to_str(uint16_t(c)); }